

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O0

char * CmdSplitLine(Abc_Frame_t *pAbc,char *sCommand,int *argc,char ***argv)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  Vec_Ptr_t *p_00;
  ushort **ppuVar5;
  void *Entry;
  char **ppcVar6;
  int double_quote;
  int single_quote;
  Vec_Ptr_t *vArgs;
  char *new_arg;
  int local_40;
  int j;
  int i;
  char c;
  char *start;
  char *p;
  char ***argv_local;
  int *argc_local;
  char *sCommand_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Vec_PtrAlloc(10);
  start = sCommand;
  while( true ) {
    while (pcVar2 = start, ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*start] & 0x2000) != 0) {
      start = start + 1;
    }
    bVar4 = false;
    bVar3 = false;
    while ((cVar1 = *start, cVar1 != '\0' &&
           ((((cVar1 != ';' && (cVar1 != '#')) &&
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)cVar1] & 0x2000) == 0)) ||
            ((bVar3 || (bVar4))))))) {
      if (cVar1 == '\'') {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      if (cVar1 == '\"') {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      start = start + 1;
    }
    if ((bVar3) || (bVar4)) {
      fprintf((FILE *)pAbc->Err,"** cmd warning: ignoring unbalanced quote ...\n");
    }
    if (pcVar2 == start) break;
    Entry = malloc((size_t)(start + (1 - (long)pcVar2)));
    new_arg._4_4_ = 0;
    for (local_40 = 0; (long)local_40 < (long)start - (long)pcVar2; local_40 = local_40 + 1) {
      cVar1 = pcVar2[local_40];
      if ((cVar1 != '\'') && (cVar1 != '\"')) {
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)cVar1] & 0x2000) == 0) {
          cVar1 = pcVar2[local_40];
        }
        else {
          cVar1 = ' ';
        }
        *(char *)((long)Entry + (long)new_arg._4_4_) = cVar1;
        new_arg._4_4_ = new_arg._4_4_ + 1;
      }
    }
    *(undefined1 *)((long)Entry + (long)new_arg._4_4_) = 0;
    Vec_PtrPush(p_00,Entry);
  }
  *argc = p_00->nSize;
  ppcVar6 = (char **)Vec_PtrReleaseArray(p_00);
  *argv = ppcVar6;
  Vec_PtrFree(p_00);
  if (*start == ';') {
    start = start + 1;
  }
  else if (*start == '#') {
    for (; *start != '\0'; start = start + 1) {
    }
  }
  return start;
}

Assistant:

const char * CmdSplitLine( Abc_Frame_t * pAbc, const char *sCommand, int *argc, char ***argv )
{
    const char *p, *start;
    char c;
    int i, j;
    char *new_arg;
    Vec_Ptr_t * vArgs;
    int single_quote, double_quote;

    vArgs = Vec_PtrAlloc( 10 );

    p = sCommand;
    for ( ;; )
    {
        // skip leading white space 
        while ( isspace( ( int ) *p ) )
        {
            p++;
        }

        // skip until end of this token 
        single_quote = double_quote = 0;
        for ( start = p; ( c = *p ) != '\0'; p++ )
        {
            if ( c == ';' || c == '#' || isspace( ( int ) c ) )
            {
                if ( !single_quote && !double_quote )
                {
                    break;
                }
            }
            if ( c == '\'' )
            {
                single_quote = !single_quote;
            }
            if ( c == '"' )
            {
                double_quote = !double_quote;
            }
        }
        if ( single_quote || double_quote )
        {
            ( void ) fprintf( pAbc->Err, "** cmd warning: ignoring unbalanced quote ...\n" );
        }
        if ( start == p )
            break;

        new_arg = ABC_ALLOC( char, p - start + 1 );
        j = 0;
        for ( i = 0; i < p - start; i++ )
        {
            c = start[i];
            if ( ( c != '\'' ) && ( c != '\"' ) )
            {
                new_arg[j++] = isspace( ( int ) c ) ? ' ' : start[i];
            }
        }
        new_arg[j] = '\0';
        Vec_PtrPush( vArgs, new_arg );
    }

    *argc = vArgs->nSize;
    *argv = (char **)Vec_PtrReleaseArray( vArgs );
    Vec_PtrFree( vArgs );
    if ( *p == ';' )
    {
        p++;
    }
    else if ( *p == '#' )
    {
        for ( ; *p != 0; p++ ); // skip to end of line 
    }
    return p;
}